

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

int slang::ast::Constraint::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  ConstraintBlockSyntax *syntax;
  ExpressionConstraintSyntax *syntax_00;
  ImplicationConstraintSyntax *syntax_01;
  ConditionalConstraintSyntax *syntax_02;
  UniquenessConstraintSyntax *syntax_03;
  DisableConstraintSyntax *syntax_04;
  SolveBeforeConstraintSyntax *syntax_05;
  LoopConstraintSyntax *syntax_06;
  logic_error *this;
  undefined4 in_register_0000003c;
  SyntaxNode *this_00;
  string local_140;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Constraint *local_68;
  Constraint *result;
  undefined1 auStack_58 [8];
  ASTContext ctx;
  ASTContext *context_local;
  ConstraintItemSyntax *syntax_local;
  
  this_00 = (SyntaxNode *)CONCAT44(in_register_0000003c,__fd);
  ctx.randomizeDetails = *(RandomizeDetails **)(__addr + 3);
  auStack_58 = *(undefined1 (*) [8])__addr;
  ctx.scope.ptr = *(Scope **)(__addr->sa_data + 6);
  ctx._8_8_ = *(undefined8 *)(__addr + 1);
  ctx.flags.m_bits = *(underlying_type *)(__addr[1].sa_data + 6);
  ctx.instanceOrProc = *(Symbol **)(__addr + 2);
  ctx.firstTempVar = *(TempVarSymbol **)(__addr[2].sa_data + 6);
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&result,AssignmentDisallowed);
  bitmask<slang::ast::ASTFlags>::operator|=
            ((bitmask<slang::ast::ASTFlags> *)&ctx.lookupIndex,
             (bitmask<slang::ast::ASTFlags> *)&result);
  SVar1 = this_00->kind;
  if (SVar1 == ConditionalConstraint) {
    syntax_02 = slang::syntax::SyntaxNode::as<slang::syntax::ConditionalConstraintSyntax>(this_00);
    local_68 = ConditionalConstraint::fromSyntax(syntax_02,(ASTContext *)auStack_58);
  }
  else if (SVar1 == ConstraintBlock) {
    syntax = slang::syntax::SyntaxNode::as<slang::syntax::ConstraintBlockSyntax>(this_00);
    local_68 = ConstraintList::fromSyntax(syntax,(ASTContext *)auStack_58);
  }
  else if (SVar1 == DisableConstraint) {
    syntax_04 = slang::syntax::SyntaxNode::as<slang::syntax::DisableConstraintSyntax>(this_00);
    local_68 = DisableSoftConstraint::fromSyntax(syntax_04,(ASTContext *)auStack_58);
  }
  else if (SVar1 == ExpressionConstraint) {
    syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionConstraintSyntax>(this_00);
    local_68 = ExpressionConstraint::fromSyntax(syntax_00,(ASTContext *)auStack_58);
  }
  else if (SVar1 == ImplicationConstraint) {
    syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::ImplicationConstraintSyntax>(this_00);
    local_68 = ImplicationConstraint::fromSyntax(syntax_01,(ASTContext *)auStack_58);
  }
  else if (SVar1 == LoopConstraint) {
    syntax_06 = slang::syntax::SyntaxNode::as<slang::syntax::LoopConstraintSyntax>(this_00);
    local_68 = ForeachConstraint::fromSyntax(syntax_06,(ASTContext *)auStack_58);
  }
  else if (SVar1 == SolveBeforeConstraint) {
    syntax_05 = slang::syntax::SyntaxNode::as<slang::syntax::SolveBeforeConstraintSyntax>(this_00);
    local_68 = SolveBeforeConstraint::fromSyntax(syntax_05,(ASTContext *)auStack_58);
  }
  else {
    if (SVar1 != UniquenessConstraint) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Constraints.cpp"
                 ,&local_109);
      std::operator+(&local_e8,&local_108,":");
      std::__cxx11::to_string(&local_140,0x39);
      std::operator+(&local_c8,&local_e8,&local_140);
      std::operator+(&local_a8,&local_c8,": ");
      std::operator+(&local_88,&local_a8,"Default case should be unreachable!");
      std::logic_error::logic_error(this,(string *)&local_88);
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    syntax_03 = slang::syntax::SyntaxNode::as<slang::syntax::UniquenessConstraintSyntax>(this_00);
    local_68 = UniquenessConstraint::fromSyntax(syntax_03,(ASTContext *)auStack_58);
  }
  local_68->syntax = (ConstraintItemSyntax *)this_00;
  return (int)local_68;
}

Assistant:

const Constraint& Constraint::bind(const ConstraintItemSyntax& syntax, const ASTContext& context) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    Constraint* result;
    switch (syntax.kind) {
        case SyntaxKind::ConstraintBlock:
            result = &ConstraintList::fromSyntax(syntax.as<ConstraintBlockSyntax>(), ctx);
            break;
        case SyntaxKind::ExpressionConstraint:
            result = &ExpressionConstraint::fromSyntax(syntax.as<ExpressionConstraintSyntax>(),
                                                       ctx);
            break;
        case SyntaxKind::ImplicationConstraint:
            result = &ImplicationConstraint::fromSyntax(syntax.as<ImplicationConstraintSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::ConditionalConstraint:
            result = &ConditionalConstraint::fromSyntax(syntax.as<ConditionalConstraintSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::UniquenessConstraint:
            result = &UniquenessConstraint::fromSyntax(syntax.as<UniquenessConstraintSyntax>(),
                                                       ctx);
            break;
        case SyntaxKind::DisableConstraint:
            result = &DisableSoftConstraint::fromSyntax(syntax.as<DisableConstraintSyntax>(), ctx);
            break;
        case SyntaxKind::SolveBeforeConstraint:
            result = &SolveBeforeConstraint::fromSyntax(syntax.as<SolveBeforeConstraintSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::LoopConstraint:
            result = &ForeachConstraint::fromSyntax(syntax.as<LoopConstraintSyntax>(), ctx);
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}